

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

size_t bssl::ssl_max_handshake_message_len(SSL *ssl)

{
  uint16_t uVar1;
  int iVar2;
  pointer pSVar3;
  unsigned_long *puVar4;
  ulong local_28 [2];
  SSL_CONFIG *config;
  SSL *ssl_local;
  
  config = (SSL_CONFIG *)ssl;
  iVar2 = SSL_in_init(ssl);
  if (iVar2 == 0) {
    uVar1 = ssl_protocol_version((SSL *)config);
    if (uVar1 < 0x304) {
      ssl_local = (SSL *)0x0;
    }
    else if (((config->alpn_client_proto_list).size_ & 0x100000000) == 0) {
      local_28[0] = (ulong)(uint)(config->supported_group_list).size_;
      puVar4 = std::max<unsigned_long>(&ssl_max_handshake_message_len::kMaxMessageLen,local_28);
      ssl_local = (SSL *)*puVar4;
    }
    else {
      ssl_local = (SSL *)0x1;
    }
  }
  else {
    pSVar3 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::get
                       ((unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)
                        &config->conf_max_version);
    if (((((config->alpn_client_proto_list).size_ & 0x100000000) == 0) ||
        ((pSVar3->verify_mode & 1) != 0)) && (0x4000 < (uint)(config->supported_group_list).size_))
    {
      ssl_local = (SSL *)(ulong)(uint)(config->supported_group_list).size_;
    }
    else {
      ssl_local = (SSL *)0x4000;
    }
  }
  return (size_t)ssl_local;
}

Assistant:

size_t ssl_max_handshake_message_len(const SSL *ssl) {
  // kMaxMessageLen is the default maximum message size for handshakes which do
  // not accept peer certificate chains.
  static const size_t kMaxMessageLen = 16384;

  if (SSL_in_init(ssl)) {
    SSL_CONFIG *config = ssl->config.get();  // SSL_in_init() implies not NULL.
    if ((!ssl->server || (config->verify_mode & SSL_VERIFY_PEER)) &&
        kMaxMessageLen < ssl->max_cert_list) {
      return ssl->max_cert_list;
    }
    return kMaxMessageLen;
  }

  if (ssl_protocol_version(ssl) < TLS1_3_VERSION) {
    // In TLS 1.2 and below, the largest acceptable post-handshake message is
    // a HelloRequest.
    return 0;
  }

  if (ssl->server) {
    // The largest acceptable post-handshake message for a server is a
    // KeyUpdate. We will never initiate post-handshake auth.
    return 1;
  }

  // Clients must accept NewSessionTicket, so allow the default size or
  // max_cert_list, whichever is greater.
  return std::max(kMaxMessageLen, size_t{ssl->max_cert_list});
}